

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

void ggml_build_forward_impl(ggml_cgraph *cgraph,ggml_tensor *tensor,_Bool expand)

{
  undefined7 in_register_00000011;
  int iVar1;
  
  if ((int)CONCAT71(in_register_00000011,expand) == 0) {
    cgraph->n_nodes = 0;
    cgraph->n_leafs = 0;
    iVar1 = 0;
  }
  else {
    iVar1 = cgraph->n_nodes;
  }
  ggml_visit_parents(cgraph,tensor);
  if ((iVar1 < cgraph->n_nodes) && (cgraph->nodes[(long)cgraph->n_nodes + -1] != tensor)) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0x2350,
            "cgraph->nodes[cgraph->n_nodes - 1] == tensor");
    abort();
  }
  return;
}

Assistant:

static void ggml_build_forward_impl(struct ggml_cgraph * cgraph, struct ggml_tensor * tensor, bool expand) {
    if (!expand) {
        cgraph->n_nodes = 0;
        cgraph->n_leafs = 0;
    }

    const int n0 = cgraph->n_nodes;
    UNUSED(n0);

    ggml_visit_parents(cgraph, tensor);

    const int n_new = cgraph->n_nodes - n0;
    GGML_PRINT_DEBUG("%s: visited %d new nodes\n", __func__, n_new);

    if (n_new > 0) {
        // the last added node should always be starting point
        GGML_ASSERT(cgraph->nodes[cgraph->n_nodes - 1] == tensor);
    }
}